

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

void __thiscall
ContextSpecificHolder<BitString,_(unsigned_char)'\x81',_(OptionType)0>::Encode
          (ContextSpecificHolder<BitString,_(unsigned_char)__x81_,_(OptionType)0> *this,uchar *pOut,
          size_t cbOut,size_t *cbUsed)

{
  long lVar1;
  ulong uVar2;
  out_of_range *this_00;
  
  uVar2 = (this->innerType).super_DerBase.cbData;
  lVar1 = 2;
  if ((((0x7f < uVar2) && (lVar1 = 3, 0xff < uVar2)) && (lVar1 = 4, 0xffff < uVar2)) &&
     (((lVar1 = 5, 0xffffff < uVar2 && (lVar1 = 6, uVar2 >> 0x20 != 0)) &&
      (lVar1 = 7, uVar2 >> 0x28 != 0)))) {
    lVar1 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  uVar2 = lVar1 + uVar2;
  if (uVar2 < 3) {
    *cbUsed = 0;
  }
  else {
    lVar1 = 2;
    if (((0x7f < uVar2) && (lVar1 = 3, 0xff < uVar2)) &&
       ((lVar1 = 4, 0xffff < uVar2 &&
        (((lVar1 = 5, 0xffffff < uVar2 && (lVar1 = 6, uVar2 >> 0x20 != 0)) &&
         (lVar1 = 7, uVar2 >> 0x28 != 0)))))) {
      lVar1 = (ulong)(uVar2 >> 0x30 == 0) << 3;
    }
    if (cbOut < lVar1 + uVar2) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Insufficient buffer");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    BitString::Encode(&this->innerType,pOut,cbOut,cbUsed);
    *pOut = 0x81;
  }
  return;
}

Assistant:

void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed)
    {
        // Handle the case where there is no data, and we shouldn't write out anything
        size_t innerSize = innerType.EncodedSize();

        if (innerSize <= 2)
        {
            cbUsed = 0;
            return;
        }

        size_t cbSize = GetSizeBytes(innerSize);

        if (1 + cbSize + innerSize > cbOut)
        {
            throw std::out_of_range("Insufficient buffer");
        }

        // A non-constructed type is the same as the type it wraps, 
        // except for the type byte, which will be ([0x80 or 0xA0] | option number)
        innerType.Encode(pOut, cbOut, cbUsed);
        *pOut = static_cast<unsigned char>(type);
    }